

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void zlib_literal(LZ77Context *ectx,uchar c)

{
  Outbuf *out;
  uchar c_local;
  LZ77Context *ectx_local;
  
  if (c < 0x90) {
    outbits((Outbuf *)ectx->userdata,(ulong)""[(int)(c + 0x30)],8);
  }
  else {
    outbits((Outbuf *)ectx->userdata,(long)(int)((uint)""[(int)(uint)c] * 2 + 1),9);
  }
  return;
}

Assistant:

static void zlib_literal(struct LZ77Context *ectx, unsigned char c)
{
    struct Outbuf *out = (struct Outbuf *) ectx->userdata;

    if (c <= 143) {
        /* 0 through 143 are 8 bits long starting at 00110000. */
        outbits(out, mirrorbytes[0x30 + c], 8);
    } else {
        /* 144 through 255 are 9 bits long starting at 110010000. */
        outbits(out, 1 + 2 * mirrorbytes[0x90 - 144 + c], 9);
    }
}